

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::register_impure_function_call(CompilerGLSL *this)

{
  uint *puVar1;
  size_t sVar2;
  SPIRVariable *pSVar3;
  long lVar4;
  
  puVar1 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.ptr;
  sVar2 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.buffer_size;
  for (lVar4 = 0; sVar2 << 2 != lVar4; lVar4 = lVar4 + 4) {
    pSVar3 = Compiler::get<spirv_cross::SPIRVariable>
                       (&this->super_Compiler,*(uint32_t *)((long)puVar1 + lVar4));
    Compiler::flush_dependees(&this->super_Compiler,pSVar3);
  }
  puVar1 = (this->super_Compiler).aliased_variables.super_VectorView<unsigned_int>.ptr;
  sVar2 = (this->super_Compiler).aliased_variables.super_VectorView<unsigned_int>.buffer_size;
  for (lVar4 = 0; sVar2 << 2 != lVar4; lVar4 = lVar4 + 4) {
    pSVar3 = Compiler::get<spirv_cross::SPIRVariable>
                       (&this->super_Compiler,*(uint32_t *)((long)puVar1 + lVar4));
    Compiler::flush_dependees(&this->super_Compiler,pSVar3);
  }
  return;
}

Assistant:

void CompilerGLSL::register_impure_function_call()
{
	// Impure functions can modify globals and aliased variables, so invalidate them as well.
	for (auto global : global_variables)
		flush_dependees(get<SPIRVariable>(global));
	for (auto aliased : aliased_variables)
		flush_dependees(get<SPIRVariable>(aliased));
}